

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_get_one_pass_rt_params
               (AV1_COMP *cpi,FRAME_TYPE *frame_type,EncodeFrameInput *frame_input,uint frame_flags)

{
  _Bool _Var1;
  int width;
  int iVar2;
  SVC *pSVar3;
  uint in_ECX;
  FRAME_TYPE *in_RSI;
  AV1_COMP *in_RDI;
  byte frame_update_type;
  double d;
  ExternalFlags *ext_flags;
  int i;
  int no_references_set;
  LAYER_CONTEXT *lc;
  double framerate;
  int layer;
  int target;
  ResizePendingParams *resize_pending_params;
  SVC *svc;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  EncodeFrameInput *in_stack_00000140;
  AV1_COMP *in_stack_00000148;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  AV1_COMP *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  FRAME_UPDATE_TYPE frame_type_00;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffffa0;
  AV1_COMP *pAVar4;
  int height;
  AV1_COMP *cpi_00;
  AV1_COMP *cpi_01;
  AV1_COMMON *src_y;
  AV1_COMP *cpi_02;
  
  height = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  cpi_02 = (AV1_COMP *)&in_RDI->ppi->p_rc;
  src_y = &in_RDI->common;
  cpi_01 = (AV1_COMP *)&in_RDI->ppi->gf_group;
  pSVar3 = &in_RDI->svc;
  cpi_00 = (AV1_COMP *)&in_RDI->resize_pending_params;
  width = pSVar3->spatial_layer_id * (in_RDI->svc).number_temporal_layers +
          (in_RDI->svc).temporal_layer_id;
  if (0 < (in_RDI->oxcf).rc_cfg.max_consec_drop_ms) {
    if (in_RDI->framerate <= 1.0) {
      in_stack_ffffffffffffff80 = (AV1_COMP *)in_RDI->framerate;
    }
    else {
      in_stack_ffffffffffffff80 = (AV1_COMP *)round(in_RDI->framerate);
    }
    pAVar4 = in_stack_ffffffffffffff80;
    d = ceil(((double)(in_RDI->oxcf).rc_cfg.max_consec_drop_ms * (double)in_stack_ffffffffffffff80)
             / 1000.0);
    height = (int)((ulong)pAVar4 >> 0x20);
    iVar2 = saturate_cast_double_to_int(d);
    (in_RDI->rc).max_consec_drop = iVar2;
  }
  if (in_RDI->ppi->use_svc != 0) {
    av1_update_temporal_layer_framerate(cpi_00);
    av1_restore_layer_context(cpi_01);
  }
  _Var1 = set_flag_rps_bias_recovery_frame
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  frame_update_type = (byte)((uint)in_stack_ffffffffffffff7c >> 0x18);
  (in_RDI->ppi->rtc_ref).bias_recovery_frame = _Var1;
  iVar2 = set_key_frame(in_RDI,in_ECX);
  if (iVar2 == 0) {
    *in_RSI = '\x01';
    ((GF_GROUP *)((cpi_01->enc_quant_dequant_params).quants.y_quant + -1))->update_type
    [in_RDI->gf_frame_index] = '\x01';
    *(FRAME_TYPE *)
     ((long)(cpi_01->enc_quant_dequant_params).quants.y_quant_shift[0x67] +
     (ulong)in_RDI->gf_frame_index) = '\x01';
    *(undefined1 *)
     ((long)(cpi_01->enc_quant_dequant_params).quants.y_quant_shift[0x76] +
     (ulong)in_RDI->gf_frame_index + 10) = 1;
    if (in_RDI->ppi->use_svc != 0) {
      if (pSVar3->spatial_layer_id == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = (in_RDI->svc).layer_context[(in_RDI->svc).temporal_layer_id].is_key_frame;
      }
      (in_RDI->svc).layer_context[width].is_key_frame = iVar2;
    }
    if ((in_RDI->ppi->rtc_ref).set_ref_frame_config != 0) {
      in_stack_ffffffffffffff94 = 1;
      for (in_stack_ffffffffffffff90 = 0; in_stack_ffffffffffffff90 < 7;
          in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
        if ((in_RDI->ppi->rtc_ref).reference[in_stack_ffffffffffffff90] != 0) {
          in_stack_ffffffffffffff94 = 0;
          break;
        }
      }
      if (in_stack_ffffffffffffff94 != 0) {
        *in_RSI = '\x02';
      }
    }
  }
  else {
    *in_RSI = '\0';
    frame_update_type = false;
    if ((src_y->current_frame).frame_number != 0) {
      frame_update_type = (in_RDI->rc).frames_to_key == 0;
    }
    *(uint *)((long)(cpi_02->enc_quant_dequant_params).quants.y_zbin[0x12] + 8) =
         (uint)frame_update_type;
    (in_RDI->rc).frames_to_key = (in_RDI->oxcf).kf_cfg.key_freq_max;
    *(int *)&cpi_02->field_0x8 = 0x8fc;
    ((GF_GROUP *)((cpi_01->enc_quant_dequant_params).quants.y_quant + -1))->update_type
    [in_RDI->gf_frame_index] = '\0';
    *(FRAME_TYPE *)
     ((long)(cpi_01->enc_quant_dequant_params).quants.y_quant_shift[0x67] +
     (ulong)in_RDI->gf_frame_index) = '\0';
    *(undefined1 *)
     ((long)(cpi_01->enc_quant_dequant_params).quants.y_quant_shift[0x76] +
     (ulong)in_RDI->gf_frame_index + 10) = 0;
    if (in_RDI->ppi->use_svc != 0) {
      if ((src_y->current_frame).frame_number != 0) {
        av1_svc_reset_temporal_layers
                  ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      }
      (in_RDI->svc).layer_context[width].is_key_frame = 1;
    }
    (in_RDI->rc).frame_number_encoded = 0;
    (in_RDI->ppi->rtc_ref).non_reference_frame = 0;
    (in_RDI->rc).static_since_last_scene_change = 0;
  }
  frame_type_00 = (FRAME_UPDATE_TYPE)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  if (((in_RDI->active_map).enabled == 0) || ((in_RDI->rc).percent_blocks_inactive != 100)) {
    if (((in_RDI->sf).rt_sf.check_scene_detection != 0) && (pSVar3->spatial_layer_id == 0)) {
      if (((in_RDI->rc).prev_coded_width == src_y->width) &&
         ((in_RDI->rc).prev_coded_height == src_y->height)) {
        rc_scene_detection_onepass_rt(in_stack_00000148,in_stack_00000140);
      }
      else {
        aom_free(in_stack_ffffffffffffff80);
        in_RDI->src_sad_blk_64x64 = (uint64_t *)0x0;
      }
    }
  }
  else {
    (in_RDI->rc).frame_source_sad = 0;
    (in_RDI->rc).avg_source_sad =
         (in_RDI->rc).avg_source_sad * 3 + (in_RDI->rc).frame_source_sad >> 2;
    (in_RDI->rc).percent_blocks_with_motion = 0;
    (in_RDI->rc).high_source_sad = 0;
  }
  if ((((*in_RSI == '\0') && ((in_RDI->sf).rt_sf.rc_adjust_keyframe != 0)) ||
      (((in_RDI->sf).rt_sf.rc_compute_spatial_var_sc != 0 && ((in_RDI->rc).high_source_sad != 0))))
     && (((pSVar3->spatial_layer_id == 0 && (src_y->seq_params->bit_depth == AOM_BITS_8)) &&
         ((in_RDI->oxcf).rc_cfg.max_intra_bitrate_pct != 0)))) {
    rc_spatial_act_onepass_rt(cpi_02,(uint8_t *)src_y,(int)((ulong)cpi_01 >> 0x20));
  }
  if ((in_RDI->oxcf).resize_cfg.resize_mode == '\x03') {
    if (((in_RDI->svc).number_spatial_layers == 1) && ((in_RDI->svc).temporal_layer_id == 0)) {
      dynamic_resize_one_pass_cbr(cpi_02);
    }
    if ((in_RDI->rc).resize_state == THREE_QUARTER) {
      *(int *)&cpi_00->ppi = (in_RDI->oxcf).frm_dim_cfg.width * 3 + 3 >> 2;
      *(int *)((long)&cpi_00->ppi + 4) = (in_RDI->oxcf).frm_dim_cfg.height * 3 + 3 >> 2;
    }
    else if ((in_RDI->rc).resize_state == ONE_HALF) {
      *(int *)&cpi_00->ppi = (in_RDI->oxcf).frm_dim_cfg.width + 1 >> 1;
      *(int *)((long)&cpi_00->ppi + 4) = (in_RDI->oxcf).frm_dim_cfg.height + 1 >> 1;
    }
    else {
      *(int *)&cpi_00->ppi = (in_RDI->oxcf).frm_dim_cfg.width;
      *(int *)((long)&cpi_00->ppi + 4) = (in_RDI->oxcf).frm_dim_cfg.height;
    }
  }
  else {
    iVar2 = is_frame_resize_pending(in_RDI);
    if (iVar2 != 0) {
      resize_reset_rc(cpi_02,(int)((ulong)src_y >> 0x20),(int)src_y,(int)((ulong)cpi_01 >> 0x20),
                      (int)cpi_01);
    }
  }
  if ((in_RDI->svc).temporal_layer_id == 0) {
    (in_RDI->rc).num_col_blscroll_last_tl0 = 0;
    (in_RDI->rc).num_row_blscroll_last_tl0 = 0;
  }
  if ((in_RDI->rc).rtc_external_ratectrl == 0) {
    set_gf_interval_update_onepass_rt
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               frame_type_00);
  }
  if ((in_RDI->oxcf).rc_cfg.mode == AOM_CBR) {
    if ((*in_RSI == '\0') || (*in_RSI == '\x02')) {
      iVar2 = av1_calc_iframe_target_size_one_pass_cbr(cpi_01);
    }
    else {
      iVar2 = av1_calc_pframe_target_size_one_pass_cbr(in_stack_ffffffffffffff80,frame_update_type);
    }
  }
  else if ((*in_RSI == '\0') || (*in_RSI == '\x02')) {
    iVar2 = av1_calc_iframe_target_size_one_pass_vbr(in_stack_ffffffffffffff80);
  }
  else {
    iVar2 = av1_calc_pframe_target_size_one_pass_vbr
                      ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       frame_type_00);
  }
  if ((in_RDI->oxcf).rc_cfg.mode == AOM_Q) {
    (in_RDI->rc).active_worst_quality = (in_RDI->oxcf).rc_cfg.cq_level;
  }
  av1_rc_set_frame_target(cpi_00,iVar2,width,height);
  (in_RDI->rc).base_frame_target = iVar2;
  (src_y->current_frame).frame_type = *in_RSI;
  if ((((in_RDI->ppi->use_svc != 0) && ((in_RDI->svc).use_flexible_mode == 0)) &&
      ((in_RDI->svc).ksvc_fixed_mode != 0)) &&
     ((1 < (in_RDI->svc).number_spatial_layers &&
      ((in_RDI->svc).layer_context[width].is_key_frame == 0)))) {
    (in_RDI->ext_flags).ref_frame_flags = (in_RDI->ext_flags).ref_frame_flags ^ 8;
  }
  return;
}

Assistant:

void av1_get_one_pass_rt_params(AV1_COMP *cpi, FRAME_TYPE *const frame_type,
                                const EncodeFrameInput *frame_input,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  SVC *const svc = &cpi->svc;
  ResizePendingParams *const resize_pending_params =
      &cpi->resize_pending_params;
  int target;
  const int layer =
      LAYER_IDS_TO_IDX(svc->spatial_layer_id, svc->temporal_layer_id,
                       svc->number_temporal_layers);
  if (cpi->oxcf.rc_cfg.max_consec_drop_ms > 0) {
    double framerate =
        cpi->framerate > 1 ? round(cpi->framerate) : cpi->framerate;
    rc->max_consec_drop = saturate_cast_double_to_int(
        ceil(cpi->oxcf.rc_cfg.max_consec_drop_ms * framerate / 1000));
  }
  if (cpi->ppi->use_svc) {
    av1_update_temporal_layer_framerate(cpi);
    av1_restore_layer_context(cpi);
  }
  cpi->ppi->rtc_ref.bias_recovery_frame = set_flag_rps_bias_recovery_frame(cpi);
  // Set frame type.
  if (set_key_frame(cpi, frame_flags)) {
    *frame_type = KEY_FRAME;
    p_rc->this_key_frame_forced =
        cm->current_frame.frame_number != 0 && rc->frames_to_key == 0;
    rc->frames_to_key = cpi->oxcf.kf_cfg.key_freq_max;
    p_rc->kf_boost = DEFAULT_KF_BOOST_RT;
    gf_group->update_type[cpi->gf_frame_index] = KF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = KEY_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_RESET;
    if (cpi->ppi->use_svc) {
      if (cm->current_frame.frame_number > 0)
        av1_svc_reset_temporal_layers(cpi, 1);
      svc->layer_context[layer].is_key_frame = 1;
    }
    rc->frame_number_encoded = 0;
    cpi->ppi->rtc_ref.non_reference_frame = 0;
    rc->static_since_last_scene_change = 0;
  } else {
    *frame_type = INTER_FRAME;
    gf_group->update_type[cpi->gf_frame_index] = LF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = INTER_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_UPDATE;
    if (cpi->ppi->use_svc) {
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      lc->is_key_frame =
          svc->spatial_layer_id == 0
              ? 0
              : svc->layer_context[svc->temporal_layer_id].is_key_frame;
    }
    // If the user is setting the reference structure with
    // set_ref_frame_config and did not set any references, set the
    // frame type to Intra-only.
    if (cpi->ppi->rtc_ref.set_ref_frame_config) {
      int no_references_set = 1;
      for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        if (cpi->ppi->rtc_ref.reference[i]) {
          no_references_set = 0;
          break;
        }
      }

      // Set to intra_only_frame if no references are set.
      // The stream can start decoding on INTRA_ONLY_FRAME so long as the
      // layer with the intra_only_frame doesn't signal a reference to a slot
      // that hasn't been set yet.
      if (no_references_set) *frame_type = INTRA_ONLY_FRAME;
    }
  }
  if (cpi->active_map.enabled && cpi->rc.percent_blocks_inactive == 100) {
    rc->frame_source_sad = 0;
    rc->avg_source_sad = (3 * rc->avg_source_sad + rc->frame_source_sad) >> 2;
    rc->percent_blocks_with_motion = 0;
    rc->high_source_sad = 0;
  } else if (cpi->sf.rt_sf.check_scene_detection &&
             svc->spatial_layer_id == 0) {
    if (rc->prev_coded_width == cm->width &&
        rc->prev_coded_height == cm->height) {
      rc_scene_detection_onepass_rt(cpi, frame_input);
    } else {
      aom_free(cpi->src_sad_blk_64x64);
      cpi->src_sad_blk_64x64 = NULL;
    }
  }
  if (((*frame_type == KEY_FRAME && cpi->sf.rt_sf.rc_adjust_keyframe) ||
       (cpi->sf.rt_sf.rc_compute_spatial_var_sc && rc->high_source_sad)) &&
      svc->spatial_layer_id == 0 && cm->seq_params->bit_depth == 8 &&
      cpi->oxcf.rc_cfg.max_intra_bitrate_pct > 0)
    rc_spatial_act_onepass_rt(cpi, frame_input->source->y_buffer,
                              frame_input->source->y_stride);
  // Check for dynamic resize, for single spatial layer for now.
  // For temporal layers only check on base temporal layer.
  if (cpi->oxcf.resize_cfg.resize_mode == RESIZE_DYNAMIC) {
    if (svc->number_spatial_layers == 1 && svc->temporal_layer_id == 0)
      dynamic_resize_one_pass_cbr(cpi);
    if (rc->resize_state == THREE_QUARTER) {
      resize_pending_params->width = (3 + cpi->oxcf.frm_dim_cfg.width * 3) >> 2;
      resize_pending_params->height =
          (3 + cpi->oxcf.frm_dim_cfg.height * 3) >> 2;
    } else if (rc->resize_state == ONE_HALF) {
      resize_pending_params->width = (1 + cpi->oxcf.frm_dim_cfg.width) >> 1;
      resize_pending_params->height = (1 + cpi->oxcf.frm_dim_cfg.height) >> 1;
    } else {
      resize_pending_params->width = cpi->oxcf.frm_dim_cfg.width;
      resize_pending_params->height = cpi->oxcf.frm_dim_cfg.height;
    }
  } else if (is_frame_resize_pending(cpi)) {
    resize_reset_rc(cpi, resize_pending_params->width,
                    resize_pending_params->height, cm->width, cm->height);
  }
  if (svc->temporal_layer_id == 0) {
    rc->num_col_blscroll_last_tl0 = 0;
    rc->num_row_blscroll_last_tl0 = 0;
  }
  // Set the GF interval and update flag.
  if (!rc->rtc_external_ratectrl)
    set_gf_interval_update_onepass_rt(cpi, *frame_type);
  // Set target size.
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_cbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  } else {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_vbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_vbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  }
  if (cpi->oxcf.rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = cpi->oxcf.rc_cfg.cq_level;

  av1_rc_set_frame_target(cpi, target, cm->width, cm->height);
  rc->base_frame_target = target;
  cm->current_frame.frame_type = *frame_type;
  // For fixed mode SVC: if KSVC is enabled remove inter layer
  // prediction on spatial enhancement layer frames for frames
  // whose base is not KEY frame.
  if (cpi->ppi->use_svc && !svc->use_flexible_mode && svc->ksvc_fixed_mode &&
      svc->number_spatial_layers > 1 &&
      !svc->layer_context[layer].is_key_frame) {
    ExternalFlags *const ext_flags = &cpi->ext_flags;
    ext_flags->ref_frame_flags ^= AOM_GOLD_FLAG;
  }
}